

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O3

void dwt_decode_1(dwt_t *v)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int *piVar14;
  
  piVar4 = v->mem;
  iVar2 = v->dn;
  lVar5 = (long)iVar2;
  uVar3 = v->sn;
  lVar6 = (long)(int)uVar3;
  if (v->cas == 0) {
    if (0 < iVar2 || 1 < (int)uVar3) {
      if (0 < (int)uVar3) {
        uVar10 = 0xffffffff;
        lVar12 = (long)(iVar2 * 2 + -1);
        lVar11 = 1;
        uVar7 = 0;
        do {
          piVar14 = piVar4 + 1;
          if ((uVar7 != 0) && (piVar14 = piVar4 + lVar12, (long)uVar7 <= lVar5)) {
            piVar14 = piVar4 + uVar10;
          }
          lVar13 = lVar12;
          if ((long)uVar7 < lVar5) {
            lVar13 = lVar11;
          }
          piVar4[uVar7 * 2] = piVar4[uVar7 * 2] - (*piVar14 + piVar4[lVar13] + 2 >> 2);
          uVar7 = uVar7 + 1;
          uVar10 = uVar10 + 2;
          lVar11 = lVar11 + 2;
        } while (uVar3 != uVar7);
      }
      if (0 < iVar2) {
        lVar11 = (long)(int)(uVar3 * 2 + -2);
        lVar13 = 1;
        lVar12 = 0;
        do {
          lVar9 = lVar11;
          if (lVar13 + -1 < lVar6) {
            lVar9 = lVar12;
          }
          lVar1 = lVar12 + 2;
          lVar8 = lVar11;
          if (lVar13 < lVar6) {
            lVar8 = lVar1;
          }
          piVar4[lVar12 + 1] = piVar4[lVar12 + 1] + (piVar4[lVar8] + piVar4[lVar9] >> 1);
          lVar13 = lVar13 + 1;
          lVar12 = lVar1;
        } while (lVar5 * 2 != lVar1);
      }
    }
  }
  else if (iVar2 == 1 && uVar3 == 0) {
    *piVar4 = *piVar4 / 2;
  }
  else {
    if (0 < (int)uVar3) {
      lVar11 = (long)(iVar2 * 2 + -2);
      lVar13 = 1;
      lVar12 = 0;
      do {
        lVar9 = lVar11;
        if (lVar13 + -1 < lVar5) {
          lVar9 = lVar12;
        }
        lVar1 = lVar12 + 2;
        lVar8 = lVar11;
        if (lVar13 < lVar5) {
          lVar8 = lVar1;
        }
        piVar4[lVar12 + 1] = piVar4[lVar12 + 1] - (piVar4[lVar9] + piVar4[lVar8] + 2 >> 2);
        lVar13 = lVar13 + 1;
        lVar12 = lVar1;
      } while ((ulong)uVar3 * 2 != lVar1);
    }
    if (0 < iVar2) {
      uVar10 = 0xffffffff;
      lVar12 = (long)(int)(uVar3 * 2 + -1);
      lVar11 = 1;
      lVar13 = 0;
      do {
        lVar9 = lVar12;
        if (lVar13 < lVar6) {
          lVar9 = lVar11;
        }
        piVar14 = piVar4 + 1;
        if ((lVar13 != 0) && (piVar14 = piVar4 + lVar12, lVar13 <= lVar6)) {
          piVar14 = piVar4 + uVar10;
        }
        piVar4[lVar13 * 2] = piVar4[lVar13 * 2] + (piVar4[lVar9] + *piVar14 >> 1);
        lVar13 = lVar13 + 1;
        uVar10 = uVar10 + 2;
        lVar11 = lVar11 + 2;
      } while (lVar5 != lVar13);
    }
  }
  return;
}

Assistant:

static void dwt_decode_1(dwt_t *v) {
	dwt_decode_1_(v->mem, v->dn, v->sn, v->cas);
}